

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O1

void cmExtraEclipseCDT4Generator::AddEnvVar
               (cmGeneratedFileStream *fout,char *envVar,cmLocalGenerator *lg)

{
  cmMakefile *pcVar1;
  char *pcVar2;
  cmState *this;
  char *pcVar3;
  cmake *pcVar4;
  long lVar5;
  size_t sVar6;
  ostream *poVar7;
  string valueToUse;
  string cacheEntryName;
  allocator local_a1;
  char *local_a0;
  char *local_98;
  char local_90;
  undefined7 uStack_8f;
  cmGeneratedFileStream *local_80;
  string local_78;
  string local_58;
  cmMakefile *local_38;
  
  pcVar1 = lg->Makefile;
  pcVar2 = getenv(envVar);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"CMAKE_ECLIPSE_ENVVAR_","");
  std::__cxx11::string::append((char *)&local_58);
  this = cmLocalGenerator::GetState(lg);
  pcVar3 = cmState::GetInitializedCacheValue(this,&local_58);
  local_a0 = &local_90;
  local_98 = (char *)0x0;
  local_90 = '\0';
  if (pcVar2 == (char *)0x0 && pcVar3 == (char *)0x0) {
    pcVar3 = "";
LAB_00436241:
    std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,(ulong)pcVar3);
  }
  else {
    if (pcVar2 == (char *)0x0 || pcVar3 != (char *)0x0) {
      local_80 = fout;
      local_38 = pcVar1;
      strlen(pcVar3);
      fout = local_80;
      if (pcVar3 != (char *)0x0 && pcVar2 == (char *)0x0) goto LAB_00436241;
      std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,(ulong)pcVar3);
      pcVar1 = local_38;
      fout = local_80;
      strlen(pcVar2);
      lVar5 = std::__cxx11::string::find((char *)&local_a0,(ulong)pcVar2,0);
      pcVar3 = local_98;
      if (lVar5 != -1) goto LAB_00436367;
      strlen(pcVar2);
      std::__cxx11::string::_M_replace((ulong)&local_a0,0,pcVar3,(ulong)pcVar2);
      cmMakefile::AddCacheDefinition
                (pcVar1,&local_58,local_a0,local_58._M_dataplus._M_p,STRING,true);
      pcVar4 = cmMakefile::GetCMakeInstance(pcVar1);
      pcVar2 = cmLocalGenerator::GetBinaryDirectory(lg);
      std::__cxx11::string::string((string *)&local_78,pcVar2,&local_a1);
      cmake::SaveCache(pcVar4,&local_78);
    }
    else {
      strlen(pcVar2);
      std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,(ulong)pcVar2);
      cmMakefile::AddCacheDefinition
                (pcVar1,&local_58,local_a0,local_58._M_dataplus._M_p,STRING,true);
      pcVar4 = cmMakefile::GetCMakeInstance(pcVar1);
      pcVar2 = cmLocalGenerator::GetBinaryDirectory(lg);
      std::__cxx11::string::string((string *)&local_78,pcVar2,&local_a1);
      cmake::SaveCache(pcVar4,&local_78);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
LAB_00436367:
  if (local_98 != (char *)0x0) {
    if (envVar == (char *)0x0) {
      std::ios::clear((int)fout +
                      (int)(fout->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>
                           ._vptr_basic_ostream[-3]);
    }
    else {
      sVar6 = strlen(envVar);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,envVar,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"=",1);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)fout,local_a0,(long)local_98);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"|",1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::AddEnvVar(cmGeneratedFileStream& fout,
                                            const char* envVar,
                                            cmLocalGenerator* lg)
{
  cmMakefile* mf = lg->GetMakefile();

  // get the variables from the environment and from the cache and then
  // figure out which one to use:

  const char* envVarValue = getenv(envVar);

  std::string cacheEntryName = "CMAKE_ECLIPSE_ENVVAR_";
  cacheEntryName += envVar;
  const char* cacheValue = lg->GetState()->GetInitializedCacheValue(
                                                       cacheEntryName);

  // now we have both, decide which one to use
  std::string valueToUse;
  if (envVarValue==0 && cacheValue==0)
    {
    // nothing known, do nothing
    valueToUse = "";
    }
  else if (envVarValue!=0 && cacheValue==0)
    {
    // The variable is in the env, but not in the cache. Use it and put it
    // in the cache
    valueToUse = envVarValue;
    mf->AddCacheDefinition(cacheEntryName, valueToUse.c_str(),
                           cacheEntryName.c_str(), cmState::STRING,
                           true);
    mf->GetCMakeInstance()->SaveCache(lg->GetBinaryDirectory());
    }
  else if (envVarValue==0 && cacheValue!=0)
    {
    // It is already in the cache, but not in the env, so use it from the cache
    valueToUse = cacheValue;
    }
  else
    {
    // It is both in the cache and in the env.
    // Use the version from the env. except if the value from the env is
    // completely contained in the value from the cache (for the case that we
    // now have a PATH without MSVC dirs in the env. but had the full PATH with
    // all MSVC dirs during the cmake run which stored the var in the cache:
    valueToUse = cacheValue;
    if (valueToUse.find(envVarValue) == std::string::npos)
      {
      valueToUse = envVarValue;
      mf->AddCacheDefinition(cacheEntryName, valueToUse.c_str(),
                             cacheEntryName.c_str(), cmState::STRING,
                             true);
      mf->GetCMakeInstance()->SaveCache(lg->GetBinaryDirectory());
      }
    }

  if (!valueToUse.empty())
    {
    fout << envVar << "=" << valueToUse << "|";
    }
}